

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void __thiscall AWeapon::AttachToOwner(AWeapon *this,AActor *other)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  AActor *pAVar3;
  AAmmo *pAVar4;
  AWeapon *q;
  APlayerPawn *pAVar5;
  AActor *other_local;
  AWeapon *this_local;
  
  AInventory::AttachToOwner(&this->super_AInventory,other);
  pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AInventory).Owner);
  pAVar4 = AddAmmo(this,pAVar3,(PClassActor *)this->AmmoType1,this->AmmoGive1);
  TObjPtr<AAmmo>::operator=(&this->Ammo1,pAVar4);
  pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AInventory).Owner);
  pAVar4 = AddAmmo(this,pAVar3,(PClassActor *)this->AmmoType2,this->AmmoGive2);
  TObjPtr<AAmmo>::operator=(&this->Ammo2,pAVar4);
  q = AddWeapon(this,this->SisterWeaponType);
  TObjPtr<AWeapon>::operator=(&this->SisterWeapon,q);
  pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
  if (pAVar3->player != (player_t *)0x0) {
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
    bVar2 = userinfo_t::GetNeverSwitch(&pAVar3->player->userinfo);
    if ((!bVar2) && ((*(uint *)&(this->super_AInventory).field_0x4dc & 0x1000) == 0)) {
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
      pAVar3->player->PendingWeapon = this;
    }
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
    pAVar1 = pAVar3->player->mo;
    pAVar5 = (APlayerPawn *)
             ::TObjPtr::operator_cast_to_AActor_
                       ((TObjPtr *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
    if (pAVar1 == pAVar5) {
      (*(StatusBar->super_DObject)._vptr_DObject[0x12])(StatusBar,this);
    }
  }
  this->GivenAsMorphWeapon = false;
  return;
}

Assistant:

void AWeapon::AttachToOwner (AActor *other)
{
	Super::AttachToOwner (other);

	Ammo1 = AddAmmo (Owner, AmmoType1, AmmoGive1);
	Ammo2 = AddAmmo (Owner, AmmoType2, AmmoGive2);
	SisterWeapon = AddWeapon (SisterWeaponType);
	if (Owner->player != NULL)
	{
		if (!Owner->player->userinfo.GetNeverSwitch() && !(WeaponFlags & WIF_NO_AUTO_SWITCH))
		{
			Owner->player->PendingWeapon = this;
		}
		if (Owner->player->mo == players[consoleplayer].camera)
		{
			StatusBar->ReceivedWeapon (this);
		}
	}
	GivenAsMorphWeapon = false; // will be set explicitly by morphing code
}